

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_setmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  TRef TVar3;
  long in_RDI;
  RecordIndex *unaff_retaddr;
  RecordIndex ix;
  TRef mtref;
  TRef fref;
  TRef mt;
  TRef tr;
  uint local_b4;
  undefined4 in_stack_ffffffffffffff58;
  IRType in_stack_ffffffffffffff5c;
  jit_State *in_stack_ffffffffffffff60;
  undefined8 in_stack_fffffffffffffff8;
  
  uVar1 = **(uint **)(in_RDI + 0x80);
  uVar2 = *(uint *)(*(long *)(in_RDI + 0x80) + 4);
  if (((uVar1 & 0x1f000000) == 0xb000000) &&
     (((uVar2 & 0x1f000000) == 0xb000000 || ((uVar2 != 0 && ((uVar2 & 0x1f000000) == 0)))))) {
    lj_record_mm_lookup((jit_State *)ix.tabv,unaff_retaddr,
                        (MMS)((ulong)in_stack_fffffffffffffff8 >> 0x20));
    *(undefined2 *)(in_RDI + 0x9c) = 0x3e05;
    *(short *)(in_RDI + 0x98) = (short)uVar1;
    *(undefined2 *)(in_RDI + 0x9a) = 3;
    TVar3 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_b4 = uVar2;
    if ((uVar2 & 0x1f000000) == 0) {
      local_b4 = lj_ir_knull(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    *(undefined2 *)(in_RDI + 0x9c) = 0x4a0b;
    *(short *)(in_RDI + 0x98) = (short)TVar3;
    *(short *)(in_RDI + 0x9a) = (short)local_b4;
    lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if ((uVar2 & 0x1f000000) != 0) {
      *(undefined2 *)(in_RDI + 0x9c) = 0x520b;
      *(short *)(in_RDI + 0x98) = (short)uVar1;
      *(undefined2 *)(in_RDI + 0x9a) = 0;
      lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    **(uint **)(in_RDI + 0x80) = uVar1;
    *(undefined1 *)(in_RDI + 0x95) = 1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_setmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef mt = J->base[1];
  if (tref_istab(tr) && (tref_istab(mt) || (mt && tref_isnil(mt)))) {
    TRef fref, mtref;
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    lj_record_mm_lookup(J, &ix, MM_metatable); /* Guard for no __metatable. */
    fref = emitir(IRT(IR_FREF, IRT_P32), tr, IRFL_TAB_META);
    mtref = tref_isnil(mt) ? lj_ir_knull(J, IRT_TAB) : mt;
    emitir(IRT(IR_FSTORE, IRT_TAB), fref, mtref);
    if (!tref_isnil(mt))
      emitir(IRT(IR_TBAR, IRT_TAB), tr, 0);
    J->base[0] = tr;
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}